

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

int ImStb::is_word_boundary_from_right(ImGuiInputTextState *obj,int idx)

{
  uint uVar1;
  unsigned_short *puVar2;
  bool bVar3;
  uint uVar4;
  
  if (idx < 1) {
    uVar4 = 1;
  }
  else {
    uVar1 = (obj->TextW).Size;
    if ((int)uVar1 < idx) {
LAB_0017270b:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x52e,"T &ImVector<unsigned short>::operator[](int) [T = unsigned short]");
    }
    puVar2 = (obj->TextW).Data;
    bVar3 = is_separator((uint)puVar2[(ulong)(uint)idx - 1]);
    uVar4 = 0;
    if (bVar3) {
      if (uVar1 <= (uint)idx) goto LAB_0017270b;
      bVar3 = is_separator((uint)puVar2[(uint)idx]);
      uVar4 = (uint)!bVar3;
    }
  }
  return uVar4;
}

Assistant:

static int  is_word_boundary_from_right(STB_TEXTEDIT_STRING* obj, int idx)      { return idx > 0 ? (is_separator( obj->TextW[idx-1] ) && !is_separator( obj->TextW[idx] ) ) : 1; }